

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

TPZFMatrix<Fad<float>_> * __thiscall
TPZFMatrix<Fad<float>_>::operator*
          (TPZFMatrix<Fad<float>_> *__return_storage_ptr__,TPZFMatrix<Fad<float>_> *this,
          Fad<float> *value)

{
  Fad<float> local_30;
  
  TPZFMatrix(__return_storage_ptr__,this);
  Fad<float>::Fad(&local_30,value);
  operator*=(__return_storage_ptr__,&local_30);
  Fad<float>::~Fad(&local_30);
  return __return_storage_ptr__;
}

Assistant:

TPZFMatrix<TVar>
TPZFMatrix<TVar>::operator*(const TVar value ) const
{
    auto res(*this);
    res *= value;
    return res;
}